

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O1

void __thiscall
QGraphicsScenePrivate::draw
          (QGraphicsScenePrivate *this,QGraphicsItem *item,QPainter *painter,
          QTransform *viewTransform,QTransform *transformPtr,QRegion *exposedRegion,QWidget *widget,
          qreal opacity,QTransform *effectTransform,bool wasDirtyParentSceneTransform,bool drawItem)

{
  undefined1 *puVar1;
  QGraphicsItemPrivate *pQVar2;
  long lVar3;
  QGraphicsItemPrivate *this_00;
  QGraphicsItem *pQVar4;
  char cVar5;
  char cVar6;
  ulong uVar7;
  QStyleOptionGraphicsItem *option;
  QPen *pQVar8;
  QBrush *pQVar9;
  undefined1 uVar10;
  QTransform *pQVar11;
  ulong uVar12;
  ulong uVar13;
  long in_FS_OFFSET;
  undefined1 auVar14 [16];
  QBrush oldBrush;
  QPainterPath clipPath;
  QRectF boundingRect;
  char local_f8;
  char local_d0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  QTransform local_88;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (item->d_ptr).d;
  uVar13 = *(ulong *)&pQVar2->field_0x160 & 0x1000000000;
  local_f8 = (char)(uVar13 >> 0x24);
  lVar3 = (pQVar2->children).d.size;
  if (lVar3 == 0) {
    uVar7 = 0;
    local_d0 = '\0';
  }
  else {
    if (uVar13 != 0) {
      pQVar11 = transformPtr;
      if (effectTransform != (QTransform *)0x0) {
        QTransform::operator*(&local_88,transformPtr);
        pQVar11 = &local_88;
      }
      QPainter::setWorldTransform((QTransform *)painter,SUB81(pQVar11,0));
    }
    QGraphicsItemPrivate::ensureSortedChildren((item->d_ptr).d);
    uVar7 = *(ulong *)&(((*(pQVar2->children).d.ptr)->d_ptr).d)->field_0x160 & 0x10000000000;
    local_d0 = (char)(uVar7 >> 0x28);
    if (uVar7 == 0) {
      uVar7 = 0;
    }
    else {
      if (uVar13 != 0) {
        QPainter::save();
        local_88.m_matrix[0][0] = 0.0;
        local_88.m_matrix[0][1] = 0.0;
        local_88.m_matrix[0][2] = 0.0;
        local_88.m_matrix[1][0] = 0.0;
        local_b0 = &DAT_aaaaaaaaaaaaaaaa;
        (*item->_vptr_QGraphicsItem[4])((QPainterPath *)&local_b0);
        cVar6 = QPathClipper::pathToRect((QPainterPath *)&local_b0,(QRectF *)&local_88);
        if (cVar6 == '\0') {
          QPainter::setClipPath((QPainterPath *)painter,(ClipOperation)&local_b0);
        }
        else {
          QRectF::normalized();
          QPainter::setClipRect((QRectF *)painter,(ClipOperation)&local_a8);
        }
        QPainterPath::~QPainterPath((QPainterPath *)&local_b0);
        local_f8 = '\0';
      }
      if ((pQVar2->children).d.size == 0) {
        uVar7 = 0;
      }
      else {
        uVar7 = 0;
        while( true ) {
          pQVar4 = (pQVar2->children).d.ptr[uVar7];
          if (wasDirtyParentSceneTransform) {
            puVar1 = &((pQVar4->d_ptr).d)->field_0x160;
            *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20000000000000;
          }
          uVar12 = *(ulong *)&((pQVar4->d_ptr).d)->field_0x160;
          if ((uVar12 & 0x10000000000) == 0) break;
          if ((0.001 <= opacity) || ((uVar12 & 0x4000000000) != 0)) {
            drawSubtreeRecursive
                      (this,pQVar4,painter,viewTransform,exposedRegion,widget,opacity,
                       effectTransform);
          }
          if (((uVar12 & 0x10000000000) == 0) ||
             (uVar7 = uVar7 + 1, (ulong)(pQVar2->children).d.size <= uVar7)) break;
        }
        uVar7 = uVar7 & 0xffffffff;
      }
    }
  }
  if (!drawItem) goto LAB_0061b57e;
  this_00 = (item->d_ptr).d;
  option = &this->styleOptionTmp;
  if (exposedRegion == (QRegion *)0x0) {
    QRegion::QRegion((QRegion *)&local_88);
  }
  else {
    QRegion::QRegion((QRegion *)&local_88,exposedRegion);
  }
  QGraphicsItemPrivate::initStyleOption
            (this_00,option,transformPtr,(QRegion *)&local_88,exposedRegion == (QRegion *)0x0);
  QRegion::~QRegion((QRegion *)&local_88);
  uVar12 = *(ulong *)&((item->d_ptr).d)->field_0x160 & 0x800000000;
  if (uVar13 == 0 || lVar3 == 0) {
    cVar6 = (char)(uVar12 >> 0x23);
    if (effectTransform == (QTransform *)0x0) {
      uVar10 = SUB81(transformPtr,0);
    }
    else {
      QTransform::operator*(&local_88,transformPtr);
      uVar10 = SUB81(&local_88,0);
    }
    QPainter::setWorldTransform((QTransform *)painter,(bool)uVar10);
    if (uVar12 != 0) {
      QPainter::save();
      local_88.m_matrix[0][0] = 0.0;
      local_88.m_matrix[0][1] = 0.0;
      local_88.m_matrix[0][2] = 0.0;
      local_88.m_matrix[1][0] = 0.0;
      local_b0 = &DAT_aaaaaaaaaaaaaaaa;
      (*item->_vptr_QGraphicsItem[4])((QPainterPath *)&local_b0,item);
      cVar5 = QPathClipper::pathToRect((QPainterPath *)&local_b0,(QRectF *)&local_88);
      if (cVar5 == '\0') {
        QPainter::setClipPath((QPainterPath *)painter,(ClipOperation)&local_b0);
      }
      else {
        QRectF::normalized();
        QPainter::setClipRect((QRectF *)painter,(ClipOperation)&local_a8);
      }
      QPainterPath::~QPainterPath((QPainterPath *)&local_b0);
    }
  }
  else if (local_d0 == '\0') {
    if (uVar12 == 0) goto LAB_0061b12d;
    QPainter::save();
    local_88.m_matrix[0][0] = 0.0;
    local_88.m_matrix[0][1] = 0.0;
    local_88.m_matrix[0][2] = 0.0;
    local_88.m_matrix[1][0] = 0.0;
    local_b0 = &DAT_aaaaaaaaaaaaaaaa;
    (*item->_vptr_QGraphicsItem[4])((QPainterPath *)&local_b0);
    cVar6 = QPathClipper::pathToRect((QPainterPath *)&local_b0,(QRectF *)&local_88);
    if (cVar6 == '\0') {
      QPainter::setClipPath((QPainterPath *)painter,(ClipOperation)&local_b0);
    }
    else {
      QRectF::normalized();
      QPainter::setClipRect((QRectF *)painter,(ClipOperation)&local_a8);
    }
    QPainterPath::~QPainterPath((QPainterPath *)&local_b0);
    cVar6 = '\0';
    local_f8 = '\0';
  }
  else if (uVar12 == 0) {
    QPainter::restore();
    local_f8 = '\x01';
LAB_0061b12d:
    cVar6 = '\0';
  }
  else {
    if (effectTransform != (QTransform *)0x0) {
      QTransform::operator*(&local_88,transformPtr);
      transformPtr = &local_88;
    }
    cVar6 = '\0';
    QPainter::setWorldTransform((QTransform *)painter,SUB81(transformPtr,0));
  }
  if (((this->field_0xb9 & 0x40) != 0) && (cVar6 == '\0')) {
    QPainter::save();
  }
  QPainter::setOpacity(opacity);
  if ((*(ushort *)&((item->d_ptr).d)->field_0x162 & 0x160) == 0) {
    (*item->_vptr_QGraphicsItem[10])(item,painter,option,widget);
  }
  else {
    drawItemHelper(this,item,painter,option,widget,
                   (bool)((byte)(*(uint *)&this->field_0xb8 >> 0xe) & 1));
  }
  if (((this->field_0xb9 & 0x40) != 0) || (cVar6 != '\0')) {
    QPainter::restore();
  }
  if (draw(QGraphicsItem*,QPainter*,QTransform_const*,QTransform_const*,QRegion*,QWidget*,double,QTransform_const*,bool,bool)
      ::drawRect == '\0') {
    draw();
  }
  if (draw::drawRect != 0) {
    local_b0 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar8 = (QPen *)QPainter::pen();
    QPen::QPen((QPen *)&local_b0,pQVar8);
    local_b8 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar9 = (QBrush *)QPainter::brush();
    QBrush::QBrush((QBrush *)&local_b8,pQVar9);
    local_a8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
    auVar14 = QColor::fromHsv((int)((ulong)item / 0xff) * -0xff + (int)item,0xff,0xff,0xff);
    local_a8 = auVar14._0_8_;
    puStack_a0._0_6_ = auVar14._8_6_;
    QPainter::setPen((QColor *)painter);
    QPainter::setBrush((BrushStyle)painter);
    local_88.m_matrix[0][2] = -NAN;
    local_88.m_matrix[1][0] = -NAN;
    local_88.m_matrix[0][0] = -NAN;
    local_88.m_matrix[0][1] = -NAN;
    (*item->_vptr_QGraphicsItem[3])(&local_88,item);
    if ((local_88.m_matrix[0][2] == 0.0) && (!NAN(local_88.m_matrix[0][2]))) {
      local_88.m_matrix[0][0] = local_88.m_matrix[0][0] + -1e-05;
      local_88.m_matrix[0][1] = local_88.m_matrix[0][1] + 0.0;
      local_88.m_matrix[0][2] = local_88.m_matrix[0][2] + 2e-05;
      local_88.m_matrix[1][0] = local_88.m_matrix[1][0] + 0.0;
    }
    if ((local_88.m_matrix[1][0] == 0.0) && (!NAN(local_88.m_matrix[1][0]))) {
      local_88.m_matrix[0][0] = local_88.m_matrix[0][0] + 0.0;
      local_88.m_matrix[0][1] = local_88.m_matrix[0][1] + -1e-05;
      local_88.m_matrix[0][2] = local_88.m_matrix[0][2] + 0.0;
      local_88.m_matrix[1][0] = local_88.m_matrix[1][0] + 2e-05;
    }
    QPainter::drawRects((QRectF *)painter,(int)&local_88);
    QPainter::setPen((QPen *)painter);
    QPainter::setBrush((QBrush *)painter);
    QBrush::~QBrush((QBrush *)&local_b8);
    QPen::~QPen((QPen *)&local_b0);
  }
LAB_0061b57e:
  if (lVar3 != 0) {
    if (local_f8 != '\0') {
      QPainter::save();
      local_88.m_matrix[0][0] = 0.0;
      local_88.m_matrix[0][1] = 0.0;
      local_88.m_matrix[0][2] = 0.0;
      local_88.m_matrix[1][0] = 0.0;
      local_b0 = &DAT_aaaaaaaaaaaaaaaa;
      (*item->_vptr_QGraphicsItem[4])((QPainterPath *)&local_b0);
      cVar6 = QPathClipper::pathToRect((QPainterPath *)&local_b0,(QRectF *)&local_88);
      if (cVar6 == '\0') {
        QPainter::setClipPath((QPainterPath *)painter,(ClipOperation)&local_b0);
      }
      else {
        QRectF::normalized();
        QPainter::setClipRect((QRectF *)painter,(ClipOperation)&local_a8);
      }
      QPainterPath::~QPainterPath((QPainterPath *)&local_b0);
    }
    if (uVar7 < (ulong)(pQVar2->children).d.size) {
      do {
        pQVar4 = (pQVar2->children).d.ptr[uVar7];
        if (wasDirtyParentSceneTransform) {
          puVar1 = &((pQVar4->d_ptr).d)->field_0x160;
          *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20000000000000;
        }
        if ((0.001 <= opacity) ||
           ((*(ulong *)&((pQVar4->d_ptr).d)->field_0x160 & 0x4000000000) != 0)) {
          drawSubtreeRecursive
                    (this,pQVar4,painter,viewTransform,exposedRegion,widget,opacity,effectTransform)
          ;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < (ulong)(pQVar2->children).d.size);
    }
    if (uVar13 != 0) {
      QPainter::restore();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScenePrivate::draw(QGraphicsItem *item, QPainter *painter, const QTransform *const viewTransform,
                                 const QTransform *const transformPtr, QRegion *exposedRegion, QWidget *widget,
                                 qreal opacity, const QTransform *effectTransform,
                                 bool wasDirtyParentSceneTransform, bool drawItem)
{
    const auto &children = item->d_ptr->children;

    const bool itemIsFullyTransparent = QGraphicsItemPrivate::isOpacityNull(opacity);
    const bool itemClipsChildrenToShape = (item->d_ptr->flags & QGraphicsItem::ItemClipsChildrenToShape);
    const bool itemHasChildren = !children.isEmpty();
    bool setChildClip = itemClipsChildrenToShape;
    bool itemHasChildrenStackedBehind = false;

    int i = 0;
    if (itemHasChildren) {
        if (itemClipsChildrenToShape)
            setWorldTransform(painter, transformPtr, effectTransform);

        item->d_ptr->ensureSortedChildren();
        // Items with the 'ItemStacksBehindParent' flag are put in front of the list
        // so all we have to do is to check the first item.
        itemHasChildrenStackedBehind = (children.at(0)->d_ptr->flags
                                        & QGraphicsItem::ItemStacksBehindParent);

        if (itemHasChildrenStackedBehind) {
            if (itemClipsChildrenToShape) {
                setClip(painter, item);
                setChildClip = false;
            }

            // Draw children behind
            for (i = 0; i < children.size(); ++i) {
                QGraphicsItem *child = children.at(i);
                if (wasDirtyParentSceneTransform)
                    child->d_ptr->dirtySceneTransform = 1;
                if (!(child->d_ptr->flags & QGraphicsItem::ItemStacksBehindParent))
                    break;
                if (itemIsFullyTransparent && !(child->d_ptr->flags & QGraphicsItem::ItemIgnoresParentOpacity))
                    continue;
                drawSubtreeRecursive(child, painter, viewTransform, exposedRegion, widget, opacity, effectTransform);
            }
        }
    }

    // Draw item
    if (drawItem) {
        Q_ASSERT(!itemIsFullyTransparent);
        Q_ASSERT(!(item->d_ptr->flags & QGraphicsItem::ItemHasNoContents));
        Q_ASSERT(transformPtr);
        item->d_ptr->initStyleOption(&styleOptionTmp, *transformPtr, exposedRegion
                                     ? *exposedRegion : QRegion(), exposedRegion == nullptr);

        const bool itemClipsToShape = item->d_ptr->flags & QGraphicsItem::ItemClipsToShape;
        bool restorePainterClip = false;

        if (!itemHasChildren || !itemClipsChildrenToShape) {
            // Item does not have children or clip children to shape.
            setWorldTransform(painter, transformPtr, effectTransform);
            if ((restorePainterClip = itemClipsToShape))
                setClip(painter, item);
        } else if (itemHasChildrenStackedBehind){
            // Item clips children to shape and has children stacked behind, which means
            // the painter is already clipped to the item's shape.
            if (itemClipsToShape) {
                // The clip is already correct. Ensure correct world transform.
                setWorldTransform(painter, transformPtr, effectTransform);
            } else {
                // Remove clip (this also ensures correct world transform).
                painter->restore();
                setChildClip = true;
            }
        } else if (itemClipsToShape) {
            // Item clips children and itself to shape. It does not have hildren stacked
            // behind, which means the clip has not yet been set. We set it now and re-use it
            // for the children.
            setClip(painter, item);
            setChildClip = false;
        }

        if (painterStateProtection && !restorePainterClip)
            painter->save();

        painter->setOpacity(opacity);
        if (!item->d_ptr->cacheMode && !item->d_ptr->isWidget)
            item->paint(painter, &styleOptionTmp, widget);
        else
            drawItemHelper(item, painter, &styleOptionTmp, widget, painterStateProtection);

        if (painterStateProtection || restorePainterClip)
            painter->restore();

        static int drawRect = qEnvironmentVariableIntValue("QT_DRAW_SCENE_ITEM_RECTS");
        if (drawRect) {
            QPen oldPen = painter->pen();
            QBrush oldBrush = painter->brush();
            quintptr ptr = reinterpret_cast<quintptr>(item);
            const QColor color = QColor::fromHsv(ptr % 255, 255, 255);
            painter->setPen(color);
            painter->setBrush(Qt::NoBrush);
            painter->drawRect(adjustedItemBoundingRect(item));
            painter->setPen(oldPen);
            painter->setBrush(oldBrush);
        }
    }

    // Draw children in front
    if (itemHasChildren) {
        if (setChildClip)
            setClip(painter, item);

        for (; i < children.size(); ++i) {
            QGraphicsItem *child = children.at(i);
            if (wasDirtyParentSceneTransform)
                child->d_ptr->dirtySceneTransform = 1;
            if (itemIsFullyTransparent && !(child->d_ptr->flags & QGraphicsItem::ItemIgnoresParentOpacity))
                continue;
            drawSubtreeRecursive(child, painter, viewTransform, exposedRegion, widget, opacity, effectTransform);
        }

        // Restore child clip
        if (itemClipsChildrenToShape)
            painter->restore();
    }
}